

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::type_function::evaluate
          (type_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  json_type jVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  unsigned_long *puVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RDI;
  reference arg0;
  string *in_stack_ffffffffffffff58;
  assertion_error *in_stack_ffffffffffffff60;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff68;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  reference local_8;
  
  this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ::size(in_RSI);
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::arity(in_RDI);
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x51f793);
  if (this_00 ==
      (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       *)*puVar3) {
    pvVar5 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,0);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::is_value(pvVar5);
    if (bVar1) {
      pvVar5 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ::operator[](in_RSI,0);
      parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::value(pvVar5);
      jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                        (in_stack_ffffffffffffff68);
      switch(jVar2) {
      case bool_value:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::boolean_type_name(this_00);
        break;
      case int64_value:
      case uint64_value:
      case double_value:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::number_type_name(this_00);
        break;
      default:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::null_type_name(this_00);
        break;
      case string_value:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::string_type_name(this_00);
        break;
      case array_value:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::array_type_name(this_00);
        break;
      case object_value:
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::object_type_name(this_00);
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)in_stack_ffffffffffffff70,
                 (jmespath_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::null_value(in_stack_ffffffffffffff70);
    }
    return local_8;
  }
  uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
  uVar4 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,uVar6));
  assertion_error::assertion_error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar4,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();

                switch (arg0.type())
                {
                    case json_type::int64_value:
                    case json_type::uint64_value:
                    case json_type::double_value:
                        return context.number_type_name();
                    case json_type::bool_value:
                        return context.boolean_type_name();
                    case json_type::string_value:
                        return context.string_type_name();
                    case json_type::object_value:
                        return context.object_type_name();
                    case json_type::array_value:
                        return context.array_type_name();
                    default:
                        return context.null_type_name();
                        break;

                }
            }